

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O2

void __thiscall cmComputeTargetDepends::CollectDepends(cmComputeTargetDepends *this)

{
  uint i;
  ulong uVar1;
  
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&(this->InitialGraph).super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             (long)(this->Targets).
                   super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->Targets).
                   super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(this->Targets).
                            super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->Targets).
                            super__Vector_base<const_cmTarget_*,_std::allocator<const_cmTarget_*>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3);
      uVar1 = (ulong)((int)uVar1 + 1)) {
    CollectTargetDepends(this,(int)uVar1);
  }
  return;
}

Assistant:

void cmComputeTargetDepends::CollectDepends()
{
  // Allocate the dependency graph adjacency lists.
  this->InitialGraph.resize(this->Targets.size());

  // Compute each dependency list.
  for(unsigned int i=0; i < this->Targets.size(); ++i)
    {
    this->CollectTargetDepends(i);
    }
}